

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

void __thiscall
vkb::detail::VulkanFunctions::init_instance_funcs(VulkanFunctions *this,VkInstance inst)

{
  PFN_vkDestroyInstance p_Var1;
  PFN_vkCreateDebugUtilsMessengerEXT p_Var2;
  PFN_vkDestroyDebugUtilsMessengerEXT p_Var3;
  PFN_vkEnumeratePhysicalDevices p_Var4;
  PFN_vkGetPhysicalDeviceFeatures p_Var5;
  PFN_vkGetPhysicalDeviceFeatures2 p_Var6;
  PFN_vkGetPhysicalDeviceFeatures2KHR p_Var7;
  PFN_vkGetPhysicalDeviceProperties p_Var8;
  PFN_vkGetPhysicalDeviceQueueFamilyProperties p_Var9;
  PFN_vkGetPhysicalDeviceMemoryProperties p_Var10;
  PFN_vkEnumerateDeviceExtensionProperties p_Var11;
  PFN_vkCreateDevice p_Var12;
  PFN_vkGetDeviceProcAddr p_Var13;
  PFN_vkDestroySurfaceKHR p_Var14;
  PFN_vkGetPhysicalDeviceSurfaceSupportKHR p_Var15;
  PFN_vkGetPhysicalDeviceSurfaceFormatsKHR p_Var16;
  PFN_vkGetPhysicalDeviceSurfacePresentModesKHR p_Var17;
  PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR p_Var18;
  
  this->instance = inst;
  p_Var1 = (PFN_vkDestroyInstance)(*this->ptr_vkGetInstanceProcAddr)(inst,"vkDestroyInstance");
  this->fp_vkDestroyInstance = p_Var1;
  p_Var2 = (PFN_vkCreateDebugUtilsMessengerEXT)
           (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkCreateDebugUtilsMessengerEXT");
  this->fp_vkCreateDebugUtilsMessengerEXT = p_Var2;
  p_Var3 = (PFN_vkDestroyDebugUtilsMessengerEXT)
           (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkDestroyDebugUtilsMessengerEXT");
  this->fp_vkDestroyDebugUtilsMessengerEXT = p_Var3;
  p_Var4 = (PFN_vkEnumeratePhysicalDevices)
           (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkEnumeratePhysicalDevices");
  this->fp_vkEnumeratePhysicalDevices = p_Var4;
  p_Var5 = (PFN_vkGetPhysicalDeviceFeatures)
           (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkGetPhysicalDeviceFeatures");
  this->fp_vkGetPhysicalDeviceFeatures = p_Var5;
  p_Var6 = (PFN_vkGetPhysicalDeviceFeatures2)
           (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkGetPhysicalDeviceFeatures2");
  this->fp_vkGetPhysicalDeviceFeatures2 = p_Var6;
  p_Var7 = (PFN_vkGetPhysicalDeviceFeatures2KHR)
           (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkGetPhysicalDeviceFeatures2KHR");
  this->fp_vkGetPhysicalDeviceFeatures2KHR = p_Var7;
  p_Var8 = (PFN_vkGetPhysicalDeviceProperties)
           (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkGetPhysicalDeviceProperties");
  this->fp_vkGetPhysicalDeviceProperties = p_Var8;
  p_Var9 = (PFN_vkGetPhysicalDeviceQueueFamilyProperties)
           (*this->ptr_vkGetInstanceProcAddr)
                     (this->instance,"vkGetPhysicalDeviceQueueFamilyProperties");
  this->fp_vkGetPhysicalDeviceQueueFamilyProperties = p_Var9;
  p_Var10 = (PFN_vkGetPhysicalDeviceMemoryProperties)
            (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkGetPhysicalDeviceMemoryProperties")
  ;
  this->fp_vkGetPhysicalDeviceMemoryProperties = p_Var10;
  p_Var11 = (PFN_vkEnumerateDeviceExtensionProperties)
            (*this->ptr_vkGetInstanceProcAddr)
                      (this->instance,"vkEnumerateDeviceExtensionProperties");
  this->fp_vkEnumerateDeviceExtensionProperties = p_Var11;
  p_Var12 = (PFN_vkCreateDevice)(*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkCreateDevice");
  this->fp_vkCreateDevice = p_Var12;
  p_Var13 = (PFN_vkGetDeviceProcAddr)
            (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkGetDeviceProcAddr");
  this->fp_vkGetDeviceProcAddr = p_Var13;
  p_Var14 = (PFN_vkDestroySurfaceKHR)
            (*this->ptr_vkGetInstanceProcAddr)(this->instance,"vkDestroySurfaceKHR");
  this->fp_vkDestroySurfaceKHR = p_Var14;
  p_Var15 = (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)
            (*this->ptr_vkGetInstanceProcAddr)
                      (this->instance,"vkGetPhysicalDeviceSurfaceSupportKHR");
  this->fp_vkGetPhysicalDeviceSurfaceSupportKHR = p_Var15;
  p_Var16 = (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)
            (*this->ptr_vkGetInstanceProcAddr)
                      (this->instance,"vkGetPhysicalDeviceSurfaceFormatsKHR");
  this->fp_vkGetPhysicalDeviceSurfaceFormatsKHR = p_Var16;
  p_Var17 = (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)
            (*this->ptr_vkGetInstanceProcAddr)
                      (this->instance,"vkGetPhysicalDeviceSurfacePresentModesKHR");
  this->fp_vkGetPhysicalDeviceSurfacePresentModesKHR = p_Var17;
  p_Var18 = (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
            (*this->ptr_vkGetInstanceProcAddr)
                      (this->instance,"vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
  this->fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR = p_Var18;
  return;
}

Assistant:

void init_instance_funcs(VkInstance inst) {
        instance = inst;
        get_inst_proc_addr(fp_vkDestroyInstance, "vkDestroyInstance");
        get_inst_proc_addr(fp_vkCreateDebugUtilsMessengerEXT, "vkCreateDebugUtilsMessengerEXT");
        get_inst_proc_addr(fp_vkDestroyDebugUtilsMessengerEXT, "vkDestroyDebugUtilsMessengerEXT");
        get_inst_proc_addr(fp_vkEnumeratePhysicalDevices, "vkEnumeratePhysicalDevices");

        get_inst_proc_addr(fp_vkGetPhysicalDeviceFeatures, "vkGetPhysicalDeviceFeatures");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceFeatures2, "vkGetPhysicalDeviceFeatures2");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceFeatures2KHR, "vkGetPhysicalDeviceFeatures2KHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceProperties, "vkGetPhysicalDeviceProperties");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceQueueFamilyProperties, "vkGetPhysicalDeviceQueueFamilyProperties");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceMemoryProperties, "vkGetPhysicalDeviceMemoryProperties");
        get_inst_proc_addr(fp_vkEnumerateDeviceExtensionProperties, "vkEnumerateDeviceExtensionProperties");

        get_inst_proc_addr(fp_vkCreateDevice, "vkCreateDevice");
        get_inst_proc_addr(fp_vkGetDeviceProcAddr, "vkGetDeviceProcAddr");

        get_inst_proc_addr(fp_vkDestroySurfaceKHR, "vkDestroySurfaceKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfaceSupportKHR, "vkGetPhysicalDeviceSurfaceSupportKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfaceFormatsKHR, "vkGetPhysicalDeviceSurfaceFormatsKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfacePresentModesKHR, "vkGetPhysicalDeviceSurfacePresentModesKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR, "vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
    }